

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

dxil_spv_result
dxil_spv_create_converter_with_reflection
          (dxil_spv_parsed_blob blob,dxil_spv_parsed_blob reflection_blob,
          dxil_spv_converter *converter)

{
  dxil_spv_result dVar1;
  dxil_spv_converter_s *this;
  
  this = (dxil_spv_converter_s *)operator_new(0x188,(nothrow_t *)&std::nothrow);
  if (this == (dxil_spv_converter_s *)0x0) {
    dVar1 = DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  else {
    dxil_spv_converter_s::dxil_spv_converter_s(this,&blob->bc,&reflection_blob->bc);
    *converter = this;
    dVar1 = DXIL_SPV_SUCCESS;
  }
  return dVar1;
}

Assistant:

dxil_spv_result dxil_spv_create_converter_with_reflection(dxil_spv_parsed_blob blob,
                                                          dxil_spv_parsed_blob reflection_blob,
                                                          dxil_spv_converter *converter)
{
	auto *conv = new (std::nothrow) dxil_spv_converter_s(blob->bc, reflection_blob ? &reflection_blob->bc : nullptr);
	if (!conv)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	*converter = conv;
	return DXIL_SPV_SUCCESS;
}